

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter_tests.cpp
# Opt level: O2

void __thiscall blockfilter_tests::blockfilters_json_test::test_method(blockfilters_json_test *this)

{
  long lVar1;
  CScript scriptPubKeyIn;
  readonly_property65 rVar2;
  bool bVar3;
  ssize_t sVar4;
  UniValue *this_00;
  UniValue *pUVar5;
  long lVar6;
  UniValue *pUVar7;
  string *psVar8;
  UniValue *this_01;
  optional<uint256> *poVar9;
  size_t in_RCX;
  undefined1 **line_num;
  char *pcVar10;
  uint uVar11;
  iterator in_R8;
  iterator pvVar12;
  iterator in_R9;
  iterator pvVar13;
  uint uVar14;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string file;
  const_string file_00;
  const_string file_01;
  string_view hex_str;
  string_view hex_str_00;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  string_view str;
  string_view str_00;
  string_view str_01;
  undefined4 uVar15;
  undefined4 uVar16;
  check_type cVar18;
  pointer pCVar17;
  vector<Coin,std::allocator<Coin>> *this_02;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  assertion_result local_388;
  char **local_370;
  assertion_result local_368;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  vector<unsigned_char,_std::allocator<unsigned_char>_> filter_basic;
  CBlockUndo block_undo;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  uint256 computed_header_basic;
  BlockFilter computed_filter_basic;
  uint256 filter_header_basic;
  uint256 prev_filter_header_basic;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_140;
  CBlock block;
  string strTest;
  UniValue json;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  json.val._M_dataplus._M_p = (pointer)&json.val.field_2;
  json.val._M_string_length = 0;
  json.val.field_2._M_local_buf[0] = '\0';
  json.typ = VNULL;
  json.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  json.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  json.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  json.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  json.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  json.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar4 = UniValue::read(&json,0x4598,json_tests::detail_blockfilters_bytes,in_RCX);
  if (((byte)sVar4 & json.typ == VARR) == 0) {
    local_220 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
    ;
    local_218 = "";
    local_230 = &boost::unit_test::basic_cstring<char_const>::null;
    local_228 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_04.m_end = in_R9;
    msg_04.m_begin = in_R8;
    file_04.m_end = (iterator)0x86;
    file_04.m_begin = (iterator)&local_220;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_230,
               msg_04);
    computed_filter_basic._0_8_ = computed_filter_basic._0_8_ & 0xffffffffffffff00;
    computed_filter_basic.m_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    computed_filter_basic.m_block_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    computed_filter_basic.m_block_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    computed_filter_basic.m_block_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    computed_filter_basic.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    computed_filter_basic.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    computed_filter_basic.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    computed_filter_basic.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    computed_filter_basic.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    computed_filter_basic.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    computed_filter_basic.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    computed_filter_basic.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    computed_filter_basic.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    computed_filter_basic.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    computed_filter_basic.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    computed_filter_basic.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    block.super_CBlockHeader._0_8_ = &PTR__lazy_ostream_0113ad90;
    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_8_ =
         boost::unit_test::lazy_ostream::inst;
    block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._20_8_ =
         anon_var_dwarf_370d73;
    local_240 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
    ;
    local_238 = "";
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&computed_filter_basic,(lazy_ostream *)&block,1,1,WARN,_cVar18,
               (size_t)&local_240,0x86);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               (computed_filter_basic.m_block_hash.super_base_blob<256U>.m_data._M_elems + 0xf));
  }
  else {
    this_00 = UniValue::get_array(&json);
    uVar11 = 0;
    while( true ) {
      pvVar12 = (iterator)(ulong)uVar11;
      if ((iterator)
          (((long)(this_00->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                  super__Vector_impl_data._M_finish -
           (long)(this_00->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_start) / 0x58) <= pvVar12) break;
      pUVar5 = UniValue::operator[](this_00,(size_t)pvVar12);
      UniValue::write_abi_cxx11_((UniValue *)&strTest,(int)pUVar5,(void *)0x0,0);
      lVar6 = (long)(pUVar5->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)(pUVar5->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                    .super__Vector_impl_data._M_start;
      if (lVar6 != 0x58) {
        if ((ulong)(lVar6 / 0x58) < 7) {
          local_250 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
          ;
          local_248 = "";
          local_260 = &boost::unit_test::basic_cstring<char_const>::null;
          local_258 = &boost::unit_test::basic_cstring<char_const>::null;
          msg.m_end = in_R9;
          msg.m_begin = pvVar12;
          file.m_end = (iterator)0x92;
          file.m_begin = (iterator)&local_250;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_260,
                     msg);
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems._0_8_ =
               prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems._0_8_ &
               0xffffffffffffff00;
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[8] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[9] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[10] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
          computed_filter_basic.m_block_hash.super_base_blob<256U>.m_data._M_elems._7_8_ =
               computed_filter_basic.m_block_hash.super_base_blob<256U>.m_data._M_elems._7_8_ &
               0xffffffffffffff00;
          computed_filter_basic._0_8_ = &PTR__lazy_ostream_01139a58;
          computed_filter_basic.m_block_hash.super_base_blob<256U>.m_data._M_elems._15_8_ =
               boost::unit_test::lazy_ostream::inst;
          computed_filter_basic.m_block_hash.super_base_blob<256U>.m_data._M_elems._23_8_ =
               anon_var_dwarf_26187a;
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
          block.super_CBlockHeader._0_8_ = &PTR__lazy_ostream_01139a98;
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_8_ =
               &computed_filter_basic;
          block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._20_8_ =
               &strTest;
          local_270 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
          ;
          local_268 = "";
          in_R9 = &DAT_00000001;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)&prev_filter_header_basic,(lazy_ostream *)&block,1,1,WARN,
                     _cVar18,(size_t)&local_270,0x92);
          boost::detail::shared_count::~shared_count
                    ((shared_count *)
                     (prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems + 0x10));
        }
        else {
          pUVar7 = UniValue::operator[](pUVar5,0);
          UniValue::getInt<int>(pUVar7);
          local_280 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
          ;
          local_278 = "";
          local_290 = &boost::unit_test::basic_cstring<char_const>::null;
          local_288 = &boost::unit_test::basic_cstring<char_const>::null;
          line_num = &local_290;
          msg_00.m_end = in_R9;
          msg_00.m_begin = pvVar12;
          file_00.m_end = (iterator)0x98;
          file_00.m_begin = (iterator)&local_280;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)line_num
                     ,msg_00);
          pUVar7 = UniValue::operator[](pUVar5,1);
          psVar8 = UniValue::get_str_abi_cxx11_(pUVar7);
          str._M_str = (char *)line_num;
          str._M_len = (size_t)(psVar8->_M_dataplus)._M_p;
          detail::FromHex<uint256>
                    ((optional<uint256> *)&block,(detail *)psVar8->_M_string_length,str);
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[8] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[9] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[10] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
          filter_header_basic.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_370d97;
          filter_header_basic.super_base_blob<256U>.m_data._M_elems._8_8_ =
               (long)"uint256::FromHex(test[pos++].get_str())" + 0x27;
          computed_filter_basic.m_block_hash.super_base_blob<256U>.m_data._M_elems._7_8_ =
               computed_filter_basic.m_block_hash.super_base_blob<256U>.m_data._M_elems._7_8_ &
               0xffffffffffffff00;
          computed_filter_basic._0_8_ = &PTR__lazy_ostream_0113a070;
          computed_filter_basic.m_block_hash.super_base_blob<256U>.m_data._M_elems._15_8_ =
               boost::unit_test::lazy_ostream::inst;
          local_2a0 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
          ;
          local_298 = "";
          pvVar12 = &DAT_00000001;
          pvVar13 = (iterator)0x0;
          computed_filter_basic.m_block_hash.super_base_blob<256U>.m_data._M_elems._23_8_ =
               &filter_header_basic.super_base_blob<256U>;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)&prev_filter_header_basic,
                     (lazy_ostream *)&computed_filter_basic,1,0,WARN,_cVar18,(size_t)&local_2a0,0x98
                    );
          boost::detail::shared_count::~shared_count
                    ((shared_count *)
                     (prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems + 0x10));
          CBlock::CBlock(&block);
          local_2b0 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
          ;
          local_2a8 = "";
          local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
          local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
          msg_01.m_end = pvVar13;
          msg_01.m_begin = pvVar12;
          file_01.m_end = (iterator)0x9b;
          file_01.m_begin = (iterator)&local_2b0;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,
                     (size_t)&local_2c0,msg_01);
          pUVar7 = UniValue::operator[](pUVar5,2);
          psVar8 = UniValue::get_str_abi_cxx11_(pUVar7);
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0] =
               DecodeHexBlk(&block,psVar8);
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[8] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[9] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[10] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
          filter_header_basic.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_370db0;
          filter_header_basic.super_base_blob<256U>.m_data._M_elems._8_8_ =
               (long)"DecodeHexBlk(block, test[pos++].get_str())" + 0x2a;
          computed_filter_basic.m_block_hash.super_base_blob<256U>.m_data._M_elems._7_8_ =
               computed_filter_basic.m_block_hash.super_base_blob<256U>.m_data._M_elems._7_8_ &
               0xffffffffffffff00;
          computed_filter_basic._0_8_ = &PTR__lazy_ostream_0113a070;
          computed_filter_basic.m_block_hash.super_base_blob<256U>.m_data._M_elems._15_8_ =
               boost::unit_test::lazy_ostream::inst;
          local_2d0 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
          ;
          local_2c8 = "";
          uVar15 = 0;
          uVar16 = 0;
          pvVar12 = (iterator)0x0;
          computed_filter_basic.m_block_hash.super_base_blob<256U>.m_data._M_elems._23_8_ =
               &filter_header_basic.super_base_blob<256U>;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)&prev_filter_header_basic,
                     (lazy_ostream *)&computed_filter_basic,2,0,WARN,_cVar18,(size_t)&local_2d0,0x9b
                    );
          boost::detail::shared_count::~shared_count
                    ((shared_count *)
                     (prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems + 0x10));
          block_undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          block_undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          block_undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<CTxUndo,_std::allocator<CTxUndo>_>::emplace_back<>(&block_undo.vtxundo);
          pCVar17 = block_undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl
                    .super__Vector_impl_data._M_finish;
          pUVar7 = UniValue::operator[](pUVar5,3);
          pUVar7 = UniValue::get_array(pUVar7);
          this_02 = (vector<Coin,std::allocator<Coin>> *)(pCVar17 + -1);
          uVar14 = 0;
          while( true ) {
            pcVar10 = &DAT_00000058;
            if ((ulong)(((long)(pUVar7->values).
                               super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(pUVar7->values).
                              super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                              super__Vector_impl_data._M_start) / 0x58) <= (ulong)uVar14) break;
            this_01 = UniValue::operator[](pUVar7,(ulong)uVar14);
            psVar8 = UniValue::get_str_abi_cxx11_(this_01);
            hex_str._M_str = (psVar8->_M_dataplus)._M_p;
            hex_str._M_len = psVar8->_M_string_length;
            ParseHex<unsigned_char>
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &prev_filter_header_basic,hex_str);
            filter_header_basic.super_base_blob<256U>.m_data._M_elems[0] = '\0';
            filter_header_basic.super_base_blob<256U>.m_data._M_elems[1] = '\0';
            filter_header_basic.super_base_blob<256U>.m_data._M_elems[2] = '\0';
            filter_header_basic.super_base_blob<256U>.m_data._M_elems[3] = '\0';
            filter_header_basic.super_base_blob<256U>.m_data._M_elems[4] = '\0';
            filter_header_basic.super_base_blob<256U>.m_data._M_elems[5] = '\0';
            filter_header_basic.super_base_blob<256U>.m_data._M_elems[6] = '\0';
            filter_header_basic.super_base_blob<256U>.m_data._M_elems[7] = '\0';
            prevector<28U,_unsigned_char,_unsigned_int,_int>::
            prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      (&local_140,
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems._0_8_,
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems._8_8_);
            scriptPubKeyIn.super_CScriptBase._union._4_4_ = uVar16;
            scriptPubKeyIn.super_CScriptBase._union._0_4_ = uVar15;
            scriptPubKeyIn.super_CScriptBase._union._8_8_ = (undefined8)_cVar18;
            scriptPubKeyIn.super_CScriptBase._union._16_8_ = pUVar5;
            scriptPubKeyIn.super_CScriptBase._24_8_ = this_02;
            CTxOut::CTxOut((CTxOut *)&computed_filter_basic,
                           (CAmount *)&filter_header_basic.super_base_blob<256U>,scriptPubKeyIn);
            prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_140);
            filter_header_basic.super_base_blob<256U>.m_data._M_elems._0_8_ =
                 filter_header_basic.super_base_blob<256U>.m_data._M_elems._0_8_ &
                 0xffffffff00000000;
            computed_header_basic.super_base_blob<256U>.m_data._M_elems._0_8_ =
                 computed_header_basic.super_base_blob<256U>.m_data._M_elems._0_8_ &
                 0xffffffffffffff00;
            std::vector<Coin,std::allocator<Coin>>::emplace_back<CTxOut&,int,bool>
                      (this_02,(CTxOut *)&computed_filter_basic,
                       (int *)&filter_header_basic.super_base_blob<256U>,
                       (bool *)&computed_header_basic);
            prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                      ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                       (computed_filter_basic.m_block_hash.super_base_blob<256U>.m_data._M_elems + 7
                       ));
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &prev_filter_header_basic);
            uVar14 = uVar14 + 1;
          }
          pUVar7 = UniValue::operator[](pUVar5,4);
          psVar8 = UniValue::get_str_abi_cxx11_(pUVar7);
          str_00._M_str = pcVar10;
          str_00._M_len = (size_t)(psVar8->_M_dataplus)._M_p;
          detail::FromHex<uint256>
                    ((optional<uint256> *)&computed_filter_basic,(detail *)psVar8->_M_string_length,
                     str_00);
          pcVar10 = "test_method";
          poVar9 = inline_assertion_check<true,std::optional<uint256>>
                             ((optional<uint256> *)&computed_filter_basic,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
                              ,0xa7,"test_method","uint256::FromHex(test[pos++].get_str())");
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems._0_8_ =
               *(undefined8 *)
                &(poVar9->super__Optional_base<uint256,_true,_true>)._M_payload.
                 super__Optional_payload_base<uint256>._M_payload;
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems._8_8_ =
               *(undefined8 *)
                ((long)&(poVar9->super__Optional_base<uint256,_true,_true>)._M_payload.
                        super__Optional_payload_base<uint256>._M_payload + 8);
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems._16_8_ =
               *(undefined8 *)
                ((long)&(poVar9->super__Optional_base<uint256,_true,_true>)._M_payload.
                        super__Optional_payload_base<uint256>._M_payload + 0x10);
          prev_filter_header_basic.super_base_blob<256U>.m_data._M_elems._24_8_ =
               *(undefined8 *)
                ((long)&(poVar9->super__Optional_base<uint256,_true,_true>)._M_payload.
                        super__Optional_payload_base<uint256>._M_payload + 0x18);
          pUVar7 = UniValue::operator[](pUVar5,5);
          psVar8 = UniValue::get_str_abi_cxx11_(pUVar7);
          hex_str_00._M_str = (psVar8->_M_dataplus)._M_p;
          hex_str_00._M_len = psVar8->_M_string_length;
          ParseHex<unsigned_char>(&filter_basic,hex_str_00);
          pUVar5 = UniValue::operator[](pUVar5,6);
          psVar8 = UniValue::get_str_abi_cxx11_(pUVar5);
          str_01._M_str = pcVar10;
          str_01._M_len = (size_t)(psVar8->_M_dataplus)._M_p;
          detail::FromHex<uint256>
                    ((optional<uint256> *)&computed_filter_basic,(detail *)psVar8->_M_string_length,
                     str_01);
          pcVar10 = "uint256::FromHex(test[pos++].get_str())";
          poVar9 = inline_assertion_check<true,std::optional<uint256>>
                             ((optional<uint256> *)&computed_filter_basic,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
                              ,0xa9,"test_method","uint256::FromHex(test[pos++].get_str())");
          filter_header_basic.super_base_blob<256U>.m_data._M_elems._0_8_ =
               *(undefined8 *)
                &(poVar9->super__Optional_base<uint256,_true,_true>)._M_payload.
                 super__Optional_payload_base<uint256>._M_payload;
          filter_header_basic.super_base_blob<256U>.m_data._M_elems._8_8_ =
               *(undefined8 *)
                ((long)&(poVar9->super__Optional_base<uint256,_true,_true>)._M_payload.
                        super__Optional_payload_base<uint256>._M_payload + 8);
          filter_header_basic.super_base_blob<256U>.m_data._M_elems._16_8_ =
               *(undefined8 *)
                ((long)&(poVar9->super__Optional_base<uint256,_true,_true>)._M_payload.
                        super__Optional_payload_base<uint256>._M_payload + 0x10);
          filter_header_basic.super_base_blob<256U>.m_data._M_elems._24_8_ =
               *(undefined8 *)
                ((long)&(poVar9->super__Optional_base<uint256,_true,_true>)._M_payload.
                        super__Optional_payload_base<uint256>._M_payload + 0x18);
          BlockFilter::BlockFilter(&computed_filter_basic,BASIC,&block,&block_undo);
          local_310 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
          ;
          local_308 = "";
          local_320 = &boost::unit_test::basic_cstring<char_const>::null;
          local_318 = &boost::unit_test::basic_cstring<char_const>::null;
          msg_02.m_end = pvVar12;
          msg_02.m_begin = pcVar10;
          file_02.m_end = (iterator)0xac;
          file_02.m_begin = (iterator)&local_310;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,
                     (size_t)&local_320,msg_02);
          rVar2.super_readonly_property<bool>.super_class_property<bool>.value =
               (readonly_property<bool>)
               std::operator==(&computed_filter_basic.m_filter.m_encoded,&filter_basic);
          local_388.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = rVar2.super_readonly_property<bool>.super_class_property<bool>.value;
          local_388.m_message.px = (element_type *)0x0;
          local_388.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_368._0_8_ = "computed_filter_basic.GetFilter().GetEncoded() == filter_basic";
          local_368.m_message.px = (element_type *)0xb60655;
          computed_header_basic.super_base_blob<256U>.m_data._M_elems[8] = '\0';
          computed_header_basic.super_base_blob<256U>.m_data._M_elems._0_8_ =
               &PTR__lazy_ostream_0113a070;
          computed_header_basic.super_base_blob<256U>.m_data._M_elems._16_8_ =
               boost::unit_test::lazy_ostream::inst;
          computed_header_basic.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_368;
          local_330 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
          ;
          local_328 = "";
          pvVar12 = &DAT_00000001;
          pvVar13 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (&local_388,(lazy_ostream *)&computed_header_basic,1,0,WARN,_cVar18,
                     (size_t)&local_330,0xac);
          boost::detail::shared_count::~shared_count(&local_388.m_message.pn);
          BlockFilter::ComputeHeader
                    (&computed_header_basic,&computed_filter_basic,&prev_filter_header_basic);
          local_340 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
          ;
          local_338 = "";
          local_350 = &boost::unit_test::basic_cstring<char_const>::null;
          local_348 = &boost::unit_test::basic_cstring<char_const>::null;
          msg_03.m_end = pvVar13;
          msg_03.m_begin = pvVar12;
          file_03.m_end = (iterator)0xaf;
          file_03.m_begin = (iterator)&local_340;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,
                     (size_t)&local_350,msg_03);
          bVar3 = ::operator==(&computed_header_basic.super_base_blob<256U>,
                               &filter_header_basic.super_base_blob<256U>);
          local_368.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(readonly_property<bool>)bVar3;
          local_368.m_message.px = (element_type *)0x0;
          local_368.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_398 = "computed_header_basic == filter_header_basic";
          local_390 = "";
          local_388.m_message.px =
               (element_type *)((ulong)local_388.m_message.px & 0xffffffffffffff00);
          local_388._0_8_ = &PTR__lazy_ostream_0113a070;
          local_388.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_370 = &local_398;
          local_3a8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
          ;
          local_3a0 = "";
          in_R9 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (&local_368,(lazy_ostream *)&local_388,1,0,WARN,_cVar18,(size_t)&local_3a8,0xaf)
          ;
          boost::detail::shared_count::~shared_count(&local_368.m_message.pn);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&computed_filter_basic.m_filter.m_encoded.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&filter_basic.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    );
          std::vector<CTxUndo,_std::allocator<CTxUndo>_>::~vector(&block_undo.vtxundo);
          std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::~vector(&block.vtx);
        }
      }
      std::__cxx11::string::~string((string *)&strTest);
      uVar11 = uVar11 + 1;
    }
  }
  UniValue::~UniValue(&json);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(blockfilters_json_test)
{
    UniValue json;
    if (!json.read(json_tests::blockfilters) || !json.isArray()) {
        BOOST_ERROR("Parse error.");
        return;
    }

    const UniValue& tests = json.get_array();
    for (unsigned int i = 0; i < tests.size(); i++) {
        const UniValue& test = tests[i];
        std::string strTest = test.write();

        if (test.size() == 1) {
            continue;
        } else if (test.size() < 7) {
            BOOST_ERROR("Bad test: " << strTest);
            continue;
        }

        unsigned int pos = 0;
        /*int block_height =*/ test[pos++].getInt<int>();
        BOOST_CHECK(uint256::FromHex(test[pos++].get_str()));

        CBlock block;
        BOOST_REQUIRE(DecodeHexBlk(block, test[pos++].get_str()));

        CBlockUndo block_undo;
        block_undo.vtxundo.emplace_back();
        CTxUndo& tx_undo = block_undo.vtxundo.back();
        const UniValue& prev_scripts = test[pos++].get_array();
        for (unsigned int ii = 0; ii < prev_scripts.size(); ii++) {
            std::vector<unsigned char> raw_script = ParseHex(prev_scripts[ii].get_str());
            CTxOut txout(0, CScript(raw_script.begin(), raw_script.end()));
            tx_undo.vprevout.emplace_back(txout, 0, false);
        }

        uint256 prev_filter_header_basic{*Assert(uint256::FromHex(test[pos++].get_str()))};
        std::vector<unsigned char> filter_basic = ParseHex(test[pos++].get_str());
        uint256 filter_header_basic{*Assert(uint256::FromHex(test[pos++].get_str()))};

        BlockFilter computed_filter_basic(BlockFilterType::BASIC, block, block_undo);
        BOOST_CHECK(computed_filter_basic.GetFilter().GetEncoded() == filter_basic);

        uint256 computed_header_basic = computed_filter_basic.ComputeHeader(prev_filter_header_basic);
        BOOST_CHECK(computed_header_basic == filter_header_basic);
    }
}